

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O2

void __thiscall xmrig::JobResultsPrivate::submit(JobResultsPrivate *this,JobResult *result)

{
  std::mutex::lock(&this->m_mutex);
  std::__cxx11::list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::push_back
            (&this->m_results,result);
  uv_async_send(this->m_async);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

inline void submit(const JobResult &result)
    {
        std::lock_guard<std::mutex> lock(m_mutex);
        m_results.push_back(result);

        uv_async_send(m_async);
    }